

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order_book.cc
# Opt level: O1

uint64_t __thiscall helix::order_book::ask_size(order_book *this,size_t level)

{
  _Self __tmp;
  _Rb_tree_node_base *p_Var1;
  _Rb_tree_header *p_Var2;
  bool bVar3;
  
  p_Var1 = (this->_asks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(this->_asks)._M_t._M_impl.super__Rb_tree_header;
  bVar3 = (_Rb_tree_header *)p_Var1 == p_Var2;
  if (!bVar3) {
    if (level != 0) {
      do {
        p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
        bVar3 = (_Rb_tree_header *)p_Var1 == p_Var2;
        if (bVar3) {
          return 0;
        }
        level = level - 1;
      } while (level != 0);
    }
    if (!bVar3) {
      return (uint64_t)p_Var1[1]._M_left;
    }
  }
  return 0;
}

Assistant:

uint64_t order_book::ask_size(size_t level) const
{
    auto it = _asks.begin();
    while (it != _asks.end() && level--) {
        it++;
    }
    if (it != _asks.end()) {
        auto&& level = it->second;
        return level.size;
    }
    return 0;
}